

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::CIRS2ICRS
               (double input_ra,double input_dec,double *return_ra,double *return_dec,CEDate *date,
               CEAngleType *angle_type)

{
  int *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double *mjd;
  double in_XMM1_Qa;
  double tdb2;
  double tdb1;
  double eo;
  double *in_stack_ffffffffffffffa8;
  undefined1 local_38 [8];
  int *local_30;
  double *local_20;
  double *local_18;
  double local_10;
  double local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (*in_RCX == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
    local_10 = in_XMM1_Qa * 0.017453292519943295;
  }
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  mjd = (double *)(**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TDB(mjd,in_stack_ffffffffffffffa8,(double *)0x14baad);
  iauAtic13(local_8,local_10,0,0,local_18,local_20,local_38);
  if (*local_30 == 0) {
    *local_18 = *local_18 * 57.29577951308232;
    *local_20 = *local_20 * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::CIRS2ICRS(double input_ra, double input_dec,
                              double *return_ra, double *return_dec,
                              const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if that's what is passed
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // Use the sofa library to convert these coordinates
    double eo ; // Equation of the origins
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
    iauAtic13(input_ra, input_dec, tdb1, tdb2, return_ra, return_dec, &eo) ;

    // Subtract the eo from RA if J2000 coordinates are desired
    //*return_ra -= eo ;
    
    // Return the coordinates in the requested units
    if (angle_type == CEAngleType::DEGREES) {
        *return_ra  *= DR2D ;
        *return_dec *= DR2D ;
    }
}